

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O1

bool crnlib::file_utils::remove_extension(dynamic_string *filename)

{
  int iVar1;
  uint len;
  
  iVar1 = dynamic_string::find_right(filename,'/');
  len = dynamic_string::find_right(filename,'.');
  if (iVar1 <= (int)len) {
    dynamic_string::left(filename,len);
  }
  return iVar1 <= (int)len;
}

Assistant:

bool file_utils::remove_extension(dynamic_string& filename)
    {
        int sep = -1;
#ifdef WIN32
        sep = filename.find_right('\\');
#endif
        if (sep < 0)
        {
            sep = filename.find_right('/');
        }

        int dot = filename.find_right('.');
        if (dot < sep)
        {
            return false;
        }

        filename.left(dot);

        return true;
    }